

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::tonk_status(Connection *this,TonkStatus *statusOut)

{
  bool bVar1;
  atomic<bool> *in_RSI;
  long in_RDI;
  
  *(uint *)in_RSI = 0;
  bVar1 = TimeSynchronizer::IsSynchronized((TimeSynchronizer *)0x1af28f);
  if (bVar1) {
    *(uint *)in_RSI = *(uint *)in_RSI | 1;
  }
  if (*(short *)(in_RDI + 0xc908) != 0) {
    *(uint *)in_RSI = *(uint *)in_RSI | 0x100;
  }
  if (*(short *)(in_RDI + 0xc90a) != 0) {
    *(uint *)in_RSI = *(uint *)in_RSI | 0x200;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                      *)0x1af2f2);
  if (bVar1) {
    *(uint *)in_RSI = *(uint *)in_RSI | 0x10000000;
  }
  bVar1 = std::atomic::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    *(uint *)in_RSI = *(uint *)in_RSI | 0x4000000;
  }
  else {
    bVar1 = std::atomic::operator_cast_to_bool(in_RSI);
    if (bVar1) {
      *(uint *)in_RSI = *(uint *)in_RSI | 0x2000000;
    }
    else {
      *(uint *)in_RSI = *(uint *)in_RSI | 0x1000000;
    }
  }
  SessionOutgoing::tonk_status((SessionOutgoing *)this,statusOut);
  *(uint *)(in_RSI + 4) = *(uint *)(in_RDI + 0xc900);
  *(uint *)(in_RSI + 0x14) = *(uint *)(*(long *)(in_RDI + 0xe0) + 0x2c);
  return;
}

Assistant:

void Connection::tonk_status(TonkStatus& statusOut)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    statusOut.Flags = 0;

    if (TimeSync.IsSynchronized()) {
        statusOut.Flags |= TonkFlag_TimeSync;
    }

    if (LocalNATMapExternalPort != 0) {
        statusOut.Flags |= TonkFlag_NATMap_Local;
    }
    if (RemoteNATMapExternalPort != 0) {
        statusOut.Flags |= TonkFlag_NATMap_Remote;
    }

    if (ResolverState) { // Set during Initialize() - safe here
        statusOut.Flags |= TonkFlag_Initiated;
    }

    if (SelfRefCount.IsShutdown()) {
        statusOut.Flags |= TonkFlag_Disconnected;
    }
    else if (ConnectionEstablished) {
        statusOut.Flags |= TonkFlag_Connected;
    }
    else {
        statusOut.Flags |= TonkFlag_Connecting;
    }

    Outgoing.tonk_status(statusOut);

    // This Id is assigned on Connection initialization and is safe to read
    statusOut.LocallyAssignedIdForRemoteHost = LocallyAssignedIdForRemoteHost;

    statusOut.TimerIntervalUsec = SocketConfig->TimerIntervalUsec;
}